

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O2

Abc_Obj_t * Abc_NtkBddDecompose(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int nLutSize,int fVerbose)

{
  int iVar1;
  DdManager *dd;
  int *piVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *vCofs;
  Vec_Ptr_t *vUniq;
  void **ppvVar4;
  long lVar5;
  DdNode *bCof;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Abc_Obj_t *pCofs [20];
  
  iVar1 = (pNode->vFanins).nSize;
  if (iVar1 <= nLutSize) {
    __assert_fail("Abc_ObjFaninNum(pNode) > nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                  ,0x253,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
  }
  dd = (DdManager *)pNode->pNtk->pManFunc;
  if ((iVar1 == nLutSize + 1) &&
     (pAVar3 = Abc_NtkBddFindCofactor(pNtkNew,pNode,nLutSize), pAVar3 != (Abc_Obj_t *)0x0)) {
    if (fVerbose != 0) {
      printf("Decomposing %d-input node %d using MUX.\n",(ulong)(uint)(pNode->vFanins).nSize,
             (ulong)(uint)pNode->Id);
    }
  }
  else {
    vCofs = Abc_NtkBddCofactors(dd,(DdNode *)(pNode->field_5).pData,nLutSize);
    vUniq = (Vec_Ptr_t *)malloc(0x10);
    uVar7 = vCofs->nSize;
    lVar10 = (long)(int)uVar7;
    vUniq->nSize = uVar7;
    iVar1 = vCofs->nCap;
    vUniq->nCap = iVar1;
    if ((long)iVar1 == 0) {
      ppvVar4 = (void **)0x0;
    }
    else {
      ppvVar4 = (void **)malloc((long)iVar1 << 3);
    }
    vUniq->pArray = ppvVar4;
    memcpy(ppvVar4,vCofs->pArray,lVar10 * 8);
    if (1 < (int)uVar7) {
      qsort(ppvVar4,(ulong)uVar7,8,Vec_PtrSortCompare);
      uVar7 = 1;
      for (lVar5 = 1; lVar10 != lVar5; lVar5 = lVar5 + 1) {
        if (ppvVar4[lVar5] != ppvVar4[lVar5 + -1]) {
          lVar6 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          ppvVar4[lVar6] = ppvVar4[lVar5];
        }
      }
      vUniq->nSize = uVar7;
    }
    if (1 << ((char)nLutSize - 2U & 0x1f) < (int)uVar7) {
      Vec_PtrFree(vCofs);
      vCofs = Abc_NtkBddCofactors(dd,(DdNode *)(pNode->field_5).pData,2);
      if (fVerbose == 0) {
        uVar7 = vCofs->nSize;
      }
      else {
        uVar7 = vCofs->nSize;
        printf("Decomposing %d-input node %d using cofactoring with %d cofactors.\n",
               (ulong)(uint)(pNode->vFanins).nSize,(ulong)(uint)pNode->Id,(ulong)uVar7);
      }
      piVar2 = (pNode->vFanins).pArray;
      ppvVar4 = pNode->pNtk->vObjs->pArray;
      pCofs[0] = *(Abc_Obj_t **)((long)ppvVar4[*piVar2] + 0x40);
      pCofs[1] = *(Abc_Obj_t **)((long)ppvVar4[piVar2[1]] + 0x40);
      uVar9 = 0;
      uVar8 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar8 = uVar9;
      }
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        bCof = (DdNode *)Vec_PtrEntry(vCofs,(int)uVar9);
        pAVar3 = Abc_NtkCreateCofLut(pNtkNew,dd,bCof,pNode,2);
        pCofs[uVar9 + 2] = pAVar3;
      }
      if (nLutSize == 6) {
        pAVar3 = Abc_NtkBddMux411(pNtkNew,pCofs);
      }
      else if (nLutSize == 5) {
        pAVar3 = Abc_NtkBddMux412a(pNtkNew,pCofs);
      }
      else {
        if (nLutSize != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                        ,0x279,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)")
          ;
        }
        pAVar3 = Abc_NtkBddMux412(pNtkNew,pCofs);
      }
    }
    else {
      if (fVerbose != 0) {
        printf("Decomposing %d-input node %d using Curtis with %d unique columns.\n",
               (ulong)(uint)(pNode->vFanins).nSize,(ulong)(uint)pNode->Id,(ulong)uVar7);
      }
      pAVar3 = Abc_NtkBddCurtis(pNtkNew,pNode,vCofs,vUniq);
    }
    Vec_PtrFree(vCofs);
    Vec_PtrFree(vUniq);
  }
  return pAVar3;
}

Assistant:

Abc_Obj_t * Abc_NtkBddDecompose( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int nLutSize, int fVerbose )
{
    Vec_Ptr_t * vCofs, * vUniq;
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    DdNode * bCof;
    Abc_Obj_t * pNodeNew = NULL;
    Abc_Obj_t * pCofs[20];
    int i;
    assert( Abc_ObjFaninNum(pNode) > nLutSize );
    // try to decompose with two LUTs (the best case for Supp = LutSize + 1)
    if ( Abc_ObjFaninNum(pNode) == nLutSize + 1 )
    {

        pNodeNew = Abc_NtkBddFindCofactor( pNtkNew, pNode, nLutSize );
        if ( pNodeNew != NULL )
        {
            if ( fVerbose )
            printf( "Decomposing %d-input node %d using MUX.\n",
                Abc_ObjFaninNum(pNode), Abc_ObjId(pNode) );
            return pNodeNew;
        }

    }
    // cofactor w.r.t. the bound set variables
    vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, nLutSize );
    vUniq = Vec_PtrDup( vCofs );
    Vec_PtrUniqify( vUniq, (int (*)())Vec_PtrSortCompare );
    // only perform decomposition with it is support reduring with two less vars
    if( Vec_PtrSize(vUniq) > (1 << (nLutSize-2)) )
    {
        Vec_PtrFree( vCofs );
        vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, 2 );
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using cofactoring with %d cofactors.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vCofs) );
        // implement the cofactors
        pCofs[0] = Abc_ObjFanin(pNode, 0)->pCopy;
        pCofs[1] = Abc_ObjFanin(pNode, 1)->pCopy;
        Vec_PtrForEachEntry( DdNode *, vCofs, bCof, i )
            pCofs[2+i] = Abc_NtkCreateCofLut( pNtkNew, dd, bCof, pNode, 2 );
        if ( nLutSize == 4 )
            pNodeNew = Abc_NtkBddMux412( pNtkNew, pCofs );
        else if ( nLutSize == 5 )
            pNodeNew = Abc_NtkBddMux412a( pNtkNew, pCofs );
        else if ( nLutSize == 6 )
            pNodeNew = Abc_NtkBddMux411( pNtkNew, pCofs );
        else  assert( 0 );
    }
    // alternative decompose using MUX-decomposition
    else
    {
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using Curtis with %d unique columns.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vUniq) );
        pNodeNew = Abc_NtkBddCurtis( pNtkNew, pNode, vCofs, vUniq );
    }
    Vec_PtrFree( vCofs );
    Vec_PtrFree( vUniq );
    return pNodeNew;
}